

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.c
# Opt level: O1

int labeled_expand(ptls_hpke_kem_t *kem,ptls_hpke_cipher_suite_t *cipher,void *output,size_t outlen,
                  ptls_iovec_t prk,char *label,ptls_iovec_t info)

{
  ptls_iovec_t info_00;
  int iVar1;
  size_t len;
  ptls_iovec_t prk_00;
  ptls_buffer_t labeled_info;
  uint8_t labeled_info_smallbuf [64];
  undefined1 local_ba;
  undefined1 local_b9;
  ptls_buffer_t local_b8;
  size_t local_90;
  uint8_t *local_88;
  size_t sStack_80;
  uint8_t local_78 [72];
  
  local_90 = prk.len;
  if (outlen < 0xffff) {
    local_b8.base = local_78;
    local_b8.off = 0;
    local_b8.capacity = 0x40;
    local_b8.is_allocated = '\0';
    local_b8.align_bits = '\0';
    local_ba = (undefined1)(outlen >> 8);
    local_b9 = (undefined1)outlen;
    iVar1 = ptls_buffer__do_pushv(&local_b8,&local_ba,2);
    if (iVar1 == 0) {
      iVar1 = ptls_buffer__do_pushv(&local_b8,"HPKE-v1",7);
      if (iVar1 == 0) {
        iVar1 = build_suite_id(&local_b8,kem,cipher);
        if (iVar1 == 0) {
          len = strlen(label);
          iVar1 = ptls_buffer__do_pushv(&local_b8,label,len);
          if (iVar1 == 0) {
            iVar1 = ptls_buffer__do_pushv(&local_b8,info.base,info.len);
            if (iVar1 == 0) {
              if (cipher != (ptls_hpke_cipher_suite_t *)0x0) {
                kem = (ptls_hpke_kem_t *)cipher;
              }
              local_88 = local_b8.base;
              sStack_80 = local_b8.off;
              info_00.len = local_b8.off;
              info_00.base = local_b8.base;
              prk_00.len = local_90;
              prk_00.base = prk.base;
              iVar1 = ptls_hkdf_expand(((ptls_hpke_cipher_suite_t *)kem)->hash,output,outlen,prk_00,
                                       info_00);
            }
          }
        }
      }
    }
    ptls_buffer__release_memory(&local_b8);
    return iVar1;
  }
  __assert_fail("outlen < UINT16_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/hpke.c",0x4d,
                "int labeled_expand(ptls_hpke_kem_t *, ptls_hpke_cipher_suite_t *, void *, size_t, ptls_iovec_t, const char *, ptls_iovec_t)"
               );
}

Assistant:

static int labeled_expand(ptls_hpke_kem_t *kem, ptls_hpke_cipher_suite_t *cipher, void *output, size_t outlen, ptls_iovec_t prk,
                          const char *label, ptls_iovec_t info)
{
    ptls_buffer_t labeled_info;
    uint8_t labeled_info_smallbuf[64];
    int ret;

    assert(outlen < UINT16_MAX);

    ptls_buffer_init(&labeled_info, labeled_info_smallbuf, sizeof(labeled_info_smallbuf));

    ptls_buffer_push16(&labeled_info, (uint16_t)outlen);
    ptls_buffer_pushv(&labeled_info, HPKE_V1_LABEL, strlen(HPKE_V1_LABEL));
    if ((ret = build_suite_id(&labeled_info, kem, cipher)) != 0)
        goto Exit;
    ptls_buffer_pushv(&labeled_info, label, strlen(label));
    ptls_buffer_pushv(&labeled_info, info.base, info.len);

    ret = ptls_hkdf_expand(cipher != NULL ? cipher->hash : kem->hash, output, outlen, prk,
                           ptls_iovec_init(labeled_info.base, labeled_info.off));

Exit:
    ptls_buffer_dispose(&labeled_info);
    return ret;
}